

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

bool __thiscall QCborStreamReader::leaveContainer(QCborStreamReader *this)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  CborError CVar7;
  iterator iVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  value_type v;
  CborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  if (*(long *)(lVar4 + 0x30) == 0) {
    leaveContainer();
  }
  else if (*(char *)(lVar4 + 0x70) == '\0') {
    iVar8 = QList<CborValue>::end((QList<CborValue> *)(lVar4 + 0x20));
    local_38.parser = iVar8.i[-1].parser;
    local_38.remaining = iVar8.i[-1].remaining;
    local_38.extra = iVar8.i[-1].extra;
    local_38.type = iVar8.i[-1].type;
    local_38.flags = iVar8.i[-1].flags;
    *(long *)(lVar4 + 0x30) = *(long *)(lVar4 + 0x30) + -1;
    local_38.source =
         (anon_union_8_2_3241046c_for_source)
         ((anon_union_8_2_3241046c_for_source *)(*(long *)(this + 8) + 0x50))->ptr;
    if ((*(byte *)(*(long *)(this + 8) + 0x5f) & 0x10) != 0) {
      *(long *)(local_38.source.ptr + 0x68) = *(long *)(local_38.source.ptr + 0x68) + 1;
      QCborStreamReaderPrivate::preread((QCborStreamReaderPrivate *)local_38.source.ptr);
    }
    CVar7 = preparse_next_value(&local_38);
    lVar4 = *(long *)(this + 8);
    *(undefined8 *)(lVar4 + 0x58) = local_38._16_8_;
    *(CborParser **)(lVar4 + 0x48) = local_38.parser;
    ((anon_union_8_2_3241046c_for_source *)(lVar4 + 0x50))->ptr = (uint8_t *)local_38.source;
    plVar5 = *(long **)(this + 8);
    bVar11 = CVar7 == CborNoError;
    if (bVar11) {
      if ((int)plVar5[0xc] == 0) {
        QVar1 = *(QCborStreamReader *)((long)plVar5 + 0x5e);
        this[0x10] = QVar1;
        if (QVar1 == (QCborStreamReader)0xff) {
          if ((*plVar5 != 0) && (plVar5[6] == 0)) {
            QByteArray::clear((QByteArray *)(plVar5 + 1));
            puVar9 = *(undefined8 **)(this + 8);
            if (puVar9[0xd] != 0) {
              QIODevice::skip((QIODevice *)*puVar9,puVar9[0xd]);
              puVar9 = *(undefined8 **)(this + 8);
            }
            puVar9[0xd] = 0;
          }
        }
        else {
          *(undefined4 *)(plVar5 + 0xc) = 0;
          if ((byte)((char)QVar1 + 0xbU) < 3) {
            this[0x10] = (QCborStreamReader)0xe0;
            *(ulong *)this = (ulong)*(byte *)(plVar5[2] + plVar5[0xd]) - 0xe0;
          }
          else {
            bVar2 = *(byte *)((long)plVar5 + 0x5f);
            if ((bVar2 & 2) == 0) {
              uVar10 = (ulong)*(ushort *)((long)plVar5 + 0x5c);
            }
            else {
              lVar4 = *(long *)(plVar5[10] + 0x10);
              lVar6 = *(long *)(plVar5[10] + 0x68);
              if ((bVar2 & 1) == 0) {
                uVar3 = *(uint *)(lVar4 + 1 + lVar6);
                uVar10 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                uVar3 << 0x18);
              }
              else {
                uVar10 = *(ulong *)(lVar4 + 1 + lVar6);
                uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                         (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                         (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
              }
            }
            *(ulong *)this = uVar10;
            if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
              this[0x10] = (QCborStreamReader)0x20;
            }
          }
        }
      }
      else {
        this[0x10] = (QCborStreamReader)0xff;
      }
    }
    else {
      if (CVar7 != CborErrorUnexpectedEOF) {
        *(undefined1 *)(plVar5 + 0xe) = 1;
      }
      *(CborError *)(plVar5 + 0xc) = CVar7;
    }
    goto LAB_0049bfa7;
  }
  bVar11 = false;
LAB_0049bfa7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QCborStreamReader::leaveContainer()
{
    if (d->containerStack.isEmpty()) {
        qWarning("QCborStreamReader::leaveContainer: trying to leave top-level element");
        return false;
    }
    if (d->corrupt)
        return false;

    CborValue container = d->containerStack.pop();
    CborError err = cbor_value_leave_container(&container, &d->currentElement);
    d->currentElement = container;
    if (err) {
        d->handleError(err);
        return false;
    }

    preparse();
    return true;
}